

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * outputBitMapFileHeader(ostream *os,BitMapFileHeader *bitMapFileHeader)

{
  BitMapFileHeader *bitMapFileHeader_local;
  ostream *os_local;
  
  std::ostream::put((char)os);
  std::ostream::put((char)os);
  putInt(os,bitMapFileHeader->bfSize);
  putShort(os,bitMapFileHeader->bfReserved1);
  putShort(os,bitMapFileHeader->bfReserved2);
  putInt(os,bitMapFileHeader->bfOffBits);
  return os;
}

Assistant:

std::ostream& outputBitMapFileHeader(std::ostream& os, const BitMapFileHeader& bitMapFileHeader) {
    os.put('B');
    os.put('M');
    putInt(os, bitMapFileHeader.bfSize);
    putShort(os, bitMapFileHeader.bfReserved1);
    putShort(os, bitMapFileHeader.bfReserved2);
    putInt(os, bitMapFileHeader.bfOffBits);
    return os;
}